

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dirichlet.cpp
# Opt level: O0

void __thiscall
despot::Dirichlet::Dirichlet(Dirichlet *this,vector<double,_std::allocator<double>_> *alpha)

{
  vector<double,_std::allocator<double>_> *alpha_local;
  Dirichlet *this_local;
  
  std::vector<double,_std::allocator<double>_>::vector(&this->alpha_);
  std::vector<double,_std::allocator<double>_>::operator=(&this->alpha_,alpha);
  return;
}

Assistant:

Dirichlet::Dirichlet(vector<double> alpha) {
	alpha_ = alpha;
}